

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

void __thiscall
CMU462::Edge::getAxes(Edge *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  pointer pVVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector3D local_30;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  p_Var1 = (this->_halfedge)._M_node;
  p_Var2 = p_Var1[2]._M_prev;
  p_Var1 = p_Var1[1]._M_prev[2]._M_prev;
  dVar6 = (double)p_Var1[1]._M_prev - (double)p_Var2[1]._M_prev;
  dVar8 = (double)p_Var1[2]._M_next - (double)p_Var2[2]._M_next;
  dVar9 = (double)p_Var1[2]._M_prev - (double)p_Var2[2]._M_prev;
  dVar4 = dVar9 * dVar9 + dVar6 * dVar6 + dVar8 * dVar8;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = 1.0 / dVar4;
  pVVar3 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3->x = dVar6 * dVar4;
  pVVar3->y = dVar8 * dVar4;
  pVVar3->z = dVar9 * dVar4;
  p_Var1 = (this->_halfedge)._M_node;
  p_Var2 = p_Var1[3]._M_prev;
  p_Var1 = p_Var1[1]._M_prev[3]._M_prev;
  dVar4 = 0.0;
  dVar6 = 0.0;
  dVar8 = 0.0;
  if (*(char *)&p_Var2[0xc]._M_next == '\0') {
    Face::normal(&local_30,(Face *)(p_Var2 + 1));
    dVar4 = local_30.x;
    dVar6 = local_30.y;
    dVar8 = local_30.z;
  }
  dVar9 = 0.0;
  dVar5 = 0.0;
  dVar7 = 0.0;
  if (*(char *)&p_Var1[0xc]._M_next == '\0') {
    Face::normal(&local_30,(Face *)(p_Var1 + 1));
    dVar9 = local_30.x;
    dVar5 = local_30.y;
    dVar7 = local_30.z;
  }
  dVar8 = dVar8 + dVar7;
  dVar6 = dVar6 + dVar5;
  dVar4 = dVar4 + dVar9;
  dVar9 = dVar8 * dVar8 + dVar4 * dVar4 + dVar6 * dVar6;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar9 = 1.0 / dVar9;
  dVar4 = dVar4 * dVar9;
  dVar6 = dVar6 * dVar9;
  dVar8 = dVar8 * dVar9;
  pVVar3 = (axes->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3[2].x = dVar4;
  pVVar3[2].y = dVar6;
  pVVar3[2].z = dVar8;
  dVar9 = pVVar3->z;
  dVar5 = pVVar3->x;
  dVar7 = pVVar3->y;
  pVVar3[1].x = dVar6 * dVar9 - dVar7 * dVar8;
  pVVar3[1].y = dVar8 * dVar5 - dVar9 * dVar4;
  pVVar3[1].z = dVar4 * dVar7 - dVar6 * dVar5;
  return;
}

Assistant:

void Edge::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the X direction to the edge direction, with
    // orientation determined by the first halfedge.
    Vector3D p0 = halfedge()->vertex()->position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = ( p1 - p0 ).unit();

    // For the Z direction, use the average of the two
    // incident triangles---or if we have a boundary edge,
    // just use the normal of the single interior face.
    Vector3D N0( 0., 0., 0. );
    Vector3D N1( 0., 0., 0. );
    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();
    if( !f0->isBoundary() ) N0 = f0->normal();
    if( !f1->isBoundary() ) N1 = f1->normal();
    axes[2] = ( N0 + N1 ).unit();

    // Choose the Y direction so that X x Y = Z
    axes[1] = cross( axes[2], axes[0] );
  }